

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  byte bVar1;
  string *psVar2;
  stringstream *psVar3;
  ostream *poVar4;
  uchar value;
  undefined3 in_register_00000011;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  string local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string *local_50;
  stringstream *local_48;
  ostream *local_40;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000011,is_attribute);
  local_50 = __return_storage_ptr__;
  Message::Message((Message *)&local_58);
  local_48 = local_58._M_head_impl;
  local_40 = (ostream *)(local_58._M_head_impl + 0x10);
  uVar5 = 0;
  do {
    psVar3 = local_48;
    psVar2 = local_50;
    if (str->_M_string_length <= uVar5) {
      StringStreamToString(local_50,local_48);
      if (psVar3 != (stringstream *)0x0) {
        (**(code **)(*(long *)psVar3 + 8))(psVar3);
      }
      return psVar2;
    }
    bVar1 = (str->_M_dataplus)._M_p[uVar5];
    if (bVar1 == 0x22) {
      pcVar6 = "&quot;";
      if ((char)local_34 == '\0') {
        std::operator<<(local_40,'\"');
        goto LAB_00120ab3;
      }
LAB_00120aaa:
      std::operator<<(local_40,pcVar6);
    }
    else {
      if (bVar1 == 0x26) {
        pcVar6 = "&amp;";
        goto LAB_00120aaa;
      }
      if (bVar1 != 0x27) {
        pcVar6 = "&gt;";
        if (bVar1 != 0x3e) {
          if (bVar1 != 0x3c) {
            uVar7 = (uint)bVar1;
            if (('\x1f' < (char)bVar1) || ((bVar1 < 0xe && ((0x2600U >> (uVar7 & 0x1f) & 1) != 0))))
            {
              if (((char)local_34 == '\0') ||
                 ((0xd < uVar7 || ((0x2600U >> (uVar7 & 0x1f) & 1) == 0)))) {
                std::operator<<(local_40,bVar1);
              }
              else {
                std::operator<<(local_40,"&#x");
                String::FormatByte_abi_cxx11_(&local_78,(String *)(ulong)uVar7,value);
                poVar4 = local_40;
                std::operator<<(local_40,(string *)&local_78);
                std::operator<<(poVar4,";");
                std::__cxx11::string::~string((string *)&local_78);
              }
            }
            goto LAB_00120ab3;
          }
          pcVar6 = "&lt;";
        }
        goto LAB_00120aaa;
      }
      pcVar6 = "&apos;";
      if ((char)local_34 != '\0') goto LAB_00120aaa;
      std::operator<<(local_40,'\'');
    }
LAB_00120ab3:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}